

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int ffffrw_work(long totalrows,long offset,long firstrow,long nrows,int nCols,iteratorCol *colData,
               void *userPtr)

{
  int iVar1;
  ParseData *lParse;
  Node *pNVar2;
  int iVar3;
  long lVar4;
  
  lParse = *(ParseData **)((long)userPtr + 8);
  Evaluate_Parser(lParse,firstrow,nrows);
  iVar3 = lParse->status;
  if (iVar3 == 0) {
    pNVar2 = lParse->Nodes;
    iVar1 = lParse->resultNode;
    if (pNVar2[iVar1].operation == -1000) {
      if (pNVar2[iVar1].value.data.log == '\0') {
        iVar3 = 0;
      }
      else {
LAB_0011d6a6:
        **userPtr = firstrow;
        iVar3 = -1;
      }
    }
    else {
      iVar3 = 0;
      if (nrows < 1) {
        nrows = 0;
      }
      for (lVar4 = 0; nrows != lVar4; lVar4 = lVar4 + 1) {
        if ((*(char *)((long)pNVar2[iVar1].value.data.dblptr + lVar4) != '\0') &&
           (pNVar2[iVar1].value.undef[lVar4] == '\0')) {
          firstrow = firstrow + lVar4;
          goto LAB_0011d6a6;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int ffffrw_work(long        totalrows, /* I - Total rows to be processed     */
                long        offset,    /* I - Number of rows skipped at start*/
                long        firstrow,  /* I - First row of this iteration    */
                long        nrows,     /* I - Number of rows in this iter    */
                int         nCols,     /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void        *userPtr ) /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which calls the parser and searches for the        */
/* first row which evaluates to TRUE.                                        */
/*---------------------------------------------------------------------------*/
{
    long idx;
    Node *result;
    ffffrw_workdata *workData = userPtr;
    ParseData *lParse = workData->lParse;

    Evaluate_Parser( lParse, firstrow, nrows );

    if( !lParse->status ) {

       result = lParse->Nodes + lParse->resultNode;
       if( result->operation==CONST_OP ) {

          if( result->value.data.log ) {
	     *(workData->prownum) = firstrow;
             return( -1 );
          }

       } else {

          for( idx=0; idx<nrows; idx++ )
             if( result->value.data.logptr[idx] && !result->value.undef[idx] ) {
	        *(workData->prownum) = firstrow + idx;;
                return( -1 );
             }
       }
    }

    return( lParse->status );
}